

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGeneratorFactory.h
# Opt level: O1

unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> __thiscall
cmGlobalGeneratorSimpleFactory<cmGlobalNinjaGenerator>::CreateGlobalGenerator
          (cmGlobalGeneratorSimpleFactory<cmGlobalNinjaGenerator> *this,string *name,bool param_2,
          cmake *cm)

{
  int iVar1;
  cmGlobalNinjaGenerator *this_00;
  undefined7 in_register_00000011;
  cmake *in_R8;
  undefined4 local_28;
  undefined2 local_24;
  
  local_28 = 0x6a6e694e;
  local_24 = 0x61;
  if (((undefined8 *)CONCAT71(in_register_00000011,param_2))[1] == 5) {
    iVar1 = bcmp(*(void **)CONCAT71(in_register_00000011,param_2),&local_28,5);
    if (iVar1 == 0) {
      this_00 = (cmGlobalNinjaGenerator *)operator_new(0xaf8);
      cmGlobalNinjaGenerator::cmGlobalNinjaGenerator(this_00,in_R8);
      goto LAB_00283abb;
    }
  }
  (this->super_cmGlobalGeneratorFactory)._vptr_cmGlobalGeneratorFactory = (_func_int **)0x0;
  this_00 = (cmGlobalNinjaGenerator *)0x0;
LAB_00283abb:
  (this->super_cmGlobalGeneratorFactory)._vptr_cmGlobalGeneratorFactory = (_func_int **)this_00;
  return (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<cmGlobalGenerator> CreateGlobalGenerator(
    const std::string& name, bool /*allowArch*/, cmake* cm) const override
  {
    if (name != T::GetActualName()) {
      return std::unique_ptr<cmGlobalGenerator>();
    }
    return std::unique_ptr<cmGlobalGenerator>(cm::make_unique<T>(cm));
  }